

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall DLevelScript::DoClassifyActor(DLevelScript *this,int tid)

{
  BYTE BVar1;
  player_t *ppVar2;
  APlayerPawn *pAVar3;
  APlayerPawn *pAVar4;
  DBot *pDVar5;
  int iVar6;
  FActorIterator it;
  
  if (tid == 0) {
    pAVar4 = (APlayerPawn *)GC::ReadBarrier<AActor>((AActor **)&this->activator);
    if (pAVar4 == (APlayerPawn *)0x0) {
      return 1;
    }
  }
  else {
    it.base = (AActor *)0x0;
    it.id = tid;
    pAVar4 = (APlayerPawn *)FActorIterator::Next(&it);
    if (pAVar4 == (APlayerPawn *)0x0) {
      return 0;
    }
  }
  ppVar2 = (pAVar4->super_AActor).player;
  if (ppVar2 == (player_t *)0x0) {
    if (((pAVar4->super_AActor).flags3.Value & 0x2000) == 0) {
      iVar6 = (uint)(((pAVar4->super_AActor).flags.Value & 0x10000) == 0) * 0x80 + 0x80;
    }
    else {
      iVar6 = (uint)((pAVar4->super_AActor).health < 1) * 0x20 + 0x30;
    }
  }
  else {
    BVar1 = ppVar2->playerstate;
    pAVar3 = ppVar2->mo;
    pDVar5 = GC::ReadBarrier<DBot>((DBot **)&ppVar2->Bot);
    iVar6 = (uint)(BVar1 == '\x01') * 0x20 + (uint)(pAVar3 != pAVar4) * 8 +
            (uint)(pDVar5 != (DBot *)0x0) * 4 + 0x22;
  }
  return iVar6;
}

Assistant:

int DLevelScript::DoClassifyActor(int tid)
{
	AActor *actor;
	int classify;

	if (tid == 0)
	{
		actor = activator;
		if (actor == NULL)
		{
			return ACTOR_WORLD;
		}
	}
	else
	{
		FActorIterator it(tid);
		actor = it.Next();
	}
	if (actor == NULL)
	{
		return ACTOR_NONE;
	}

	classify = 0;
	if (actor->player != NULL)
	{
		classify |= ACTOR_PLAYER;
		if (actor->player->playerstate == PST_DEAD)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
		if (actor->player->mo != actor)
		{
			classify |= ACTOR_VOODOODOLL;
		}
		if (actor->player->Bot != NULL)
		{
			classify |= ACTOR_BOT;
		}
	}
	else if (actor->flags3 & MF3_ISMONSTER)
	{
		classify |= ACTOR_MONSTER;
		if (actor->health <= 0)
		{
			classify |= ACTOR_DEAD;
		}
		else
		{
			classify |= ACTOR_ALIVE;
		}
	}
	else if (actor->flags & MF_MISSILE)
	{
		classify |= ACTOR_MISSILE;
	}
	else
	{
		classify |= ACTOR_GENERIC;
	}
	return classify;
}